

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

uint32_t ts_lexer__get_column(TSLexer *payload)

{
  uint uVar1;
  _func_uint32_t_TSLexer_ptr *p_Var2;
  _func_uint32_t_TSLexer_ptr *p_Var3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar1 = payload[1].lookahead;
  uVar5 = uVar1 - *(int *)&payload[1].advance;
  payload[1].lookahead = uVar5;
  *(undefined4 *)&payload[1].advance = 0;
  if (uVar5 < *(uint *)&payload[2].is_at_included_range_start) {
    *(uint *)&payload[2].is_at_included_range_start = uVar5;
    p_Var2 = (_func_uint32_t_TSLexer_ptr *)(*payload[3].mark_end)((TSLexer *)payload[3].advance);
    p_Var3 = (_func_uint32_t_TSLexer_ptr *)"";
    if (*(int *)((long)&payload[2].is_at_included_range_start + 4) != 0) {
      p_Var3 = p_Var2;
    }
    payload[2].get_column = p_Var3;
    uVar5 = payload[1].lookahead;
  }
  uVar4 = 0;
  if (uVar5 < uVar1) {
    uVar4 = 0;
    do {
      ts_lexer__advance(payload,false);
      uVar4 = uVar4 + 1;
    } while ((uint)payload[1].lookahead < uVar1);
  }
  return uVar4;
}

Assistant:

static uint32_t ts_lexer__get_column(TSLexer *payload) {
  Lexer *self = (Lexer *)payload;
  uint32_t goal_byte = self->current_position.bytes;

  self->current_position.bytes -= self->current_position.extent.column;
  self->current_position.extent.column = 0;

  if (self->current_position.bytes < self->chunk_start) {
    ts_lexer__get_chunk(self);
  }

  uint32_t result = 0;
  while (self->current_position.bytes < goal_byte) {
    ts_lexer__advance(payload, false);
    result++;
  }

  return result;
}